

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::callSolveLp(Highs *this,HighsLp *lp,string *message)

{
  HighsStatus HVar1;
  HighsLpSolverObject solver_object;
  allocator local_a9;
  string local_a8;
  string local_88;
  HighsLpSolverObject local_68;
  
  local_68.basis_ = &this->basis_;
  local_68.solution_ = &this->solution_;
  local_68.highs_info_ = &this->info_;
  local_68.ekk_instance_ = &this->ekk_instance_;
  local_68.callback_ = &this->callback_;
  local_68.options_ = &this->options_;
  local_68.timer_ = &this->timer_;
  local_68.model_status_ = kMin;
  local_68.lp_ = lp;
  std::__cxx11::string::string((string *)&local_88,(string *)message);
  HVar1 = solveLp(&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  this->model_status_ = local_68.model_status_;
  if (local_68.model_status_ == kOptimal) {
    std::__cxx11::string::string((string *)&local_a8,"LP",&local_a9);
    HVar1 = checkOptimality(this,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return HVar1;
}

Assistant:

HighsStatus Highs::callSolveLp(HighsLp& lp, const string message) {
  HighsStatus return_status = HighsStatus::kOk;

  HighsLpSolverObject solver_object(lp, basis_, solution_, info_, ekk_instance_,
                                    callback_, options_, timer_);

  // Check that the model is column-wise
  assert(model_.lp_.a_matrix_.isColwise());

  // Solve the LP
  return_status = solveLp(solver_object, message);
  // Extract the model status
  model_status_ = solver_object.model_status_;
  if (model_status_ == HighsModelStatus::kOptimal) return checkOptimality("LP");
  return return_status;
}